

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall
argparse::ArgumentParser::ArgumentParser
          (ArgumentParser *this,string *aProgramName,string *aVersion,default_arguments aArgs)

{
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *plVar1;
  _Rb_tree_header *p_Var2;
  Argument *pAVar3;
  allocator<char> local_aa;
  bool local_a9;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *local_a8;
  string *local_a0;
  anon_class_8_1_8991fb9c local_98;
  any local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  any local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string(&this->mProgramName,aProgramName);
  std::__cxx11::string::string(&this->mVersion,aVersion);
  plVar1 = &this->mPositionalArguments;
  (this->mDescription)._M_dataplus._M_p = (pointer)&(this->mDescription).field_2;
  (this->mDescription)._M_string_length = 0;
  (this->mDescription).field_2._M_local_buf[0] = '\0';
  (this->mEpilog)._M_dataplus._M_p = (pointer)&(this->mEpilog).field_2;
  p_Var2 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mEpilog)._M_string_length = 0;
  (this->mEpilog).field_2._M_local_buf[0] = '\0';
  this->mIsParsed = false;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((aArgs & help) != none) {
    pAVar3 = add_argument<char_const*,char_const*>(this,"-h","--help");
    local_a8 = plVar1;
    local_a0 = &this->mVersion;
    local_98.this = this;
    std::
    variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
    ::
    emplace<1ul,argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments)::_lambda(auto:1_const&)_1_>
              ((variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
                *)&pAVar3->mAction,&local_98);
    local_a9 = false;
    pAVar3 = Argument::default_value<bool>(pAVar3,&local_a9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"shows help message and exits",&local_aa);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pAVar3->mHelp,&local_50);
    local_60._M_manager = std::any::_Manager_internal<bool>::_S_manage;
    local_60._M_storage = (_Storage)0x1;
    pAVar3 = Argument::implicit_value(pAVar3,&local_60);
    pAVar3->mNumArgs = 0;
    std::any::reset(&local_60);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((aArgs & version) != none) {
    pAVar3 = add_argument<char_const*,char_const*>(this,"-v","--version");
    local_98.this = this;
    std::
    variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
    ::
    emplace<1ul,argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments)::_lambda(auto:1_const&)_2_>
              ((variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
                *)&pAVar3->mAction,&local_98);
    local_a9 = false;
    pAVar3 = Argument::default_value<bool>(pAVar3,&local_a9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"prints version information and exits",&local_aa);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pAVar3->mHelp,&local_80);
    local_90._M_manager = std::any::_Manager_internal<bool>::_S_manage;
    local_90._M_storage = (_Storage)0x1;
    pAVar3 = Argument::implicit_value(pAVar3,&local_90);
    pAVar3->mNumArgs = 0;
    std::any::reset(&local_90);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {},
                                std::string aVersion = "1.0",
                                default_arguments aArgs = default_arguments::all)
                : mProgramName(std::move(aProgramName)), mVersion(std::move(aVersion)) {
            if (aArgs & default_arguments::help) {
                add_argument("-h", "--help")
                        .action([&](const auto &) {
                            std::cout << help().str();
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("shows help message and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
            if (aArgs & default_arguments::version) {
                add_argument("-v", "--version")
                        .action([&](const auto &) {
                            std::cout << mVersion;
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("prints version information and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
        }